

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

bool xla::ForwardDFS(Rep *r,int32_t n,int32_t upper_bound)

{
  vector<int,_std::allocator<int>_> *this;
  int iVar1;
  pointer piVar2;
  pointer pNVar3;
  pointer pNVar4;
  int *piVar5;
  iterator iVar6;
  int *piVar7;
  int w;
  int32_t local_40;
  int local_3c;
  vector<int,std::allocator<int>> *local_38;
  
  piVar2 = (r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  piVar7 = (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  iVar6._M_current =
       (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar6._M_current != piVar7) {
    (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar7;
    iVar6._M_current = piVar7;
  }
  this = &r->stack_;
  if (iVar6._M_current ==
      (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    local_40 = n;
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)this,iVar6,&local_40);
    piVar7 = (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  else {
    *iVar6._M_current = n;
    piVar7 = iVar6._M_current + 1;
    (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar7;
  }
  if ((this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
      != piVar7) {
    local_38 = (vector<int,std::allocator<int>> *)&r->deltaf_;
    do {
      local_40 = piVar7[-1];
      (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar7 + -1;
      pNVar3 = (r->nodes_).
               super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pNVar3[local_40].visited == false) {
        pNVar3[local_40].visited = true;
        iVar6._M_current =
             (r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_38,iVar6,&local_40);
        }
        else {
          *iVar6._M_current = local_40;
          (r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_finish = iVar6._M_current + 1;
        }
        pNVar4 = (r->node_io_).
                 super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar5 = *(pointer *)
                  ((long)&pNVar4[local_40].out.value_sequence_.
                          super__Vector_base<int,_std::allocator<int>_> + 8);
        for (piVar7 = *(int **)&pNVar4[local_40].out.value_sequence_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl;
            piVar7 != piVar5; piVar7 = piVar7 + 1) {
          local_3c = *piVar7;
          pNVar3 = (r->nodes_).
                   super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar1 = pNVar3[local_3c].rank;
          if (iVar1 == upper_bound) {
            return false;
          }
          if ((iVar1 < upper_bound) && (pNVar3[local_3c].visited == false)) {
            iVar6._M_current =
                 (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar6._M_current ==
                (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)this,iVar6,&local_3c);
            }
            else {
              *iVar6._M_current = local_3c;
              (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar6._M_current + 1;
            }
          }
        }
      }
      piVar7 = (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while ((r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start != piVar7);
  }
  return true;
}

Assistant:

static bool ForwardDFS(GraphCycles::Rep* r, int32_t n, int32_t upper_bound) {
  // Avoid recursion since stack space might be limited.
  // We instead keep a stack of nodes to visit.
  r->deltaf_.clear();
  r->stack_.clear();
  r->stack_.push_back(n);
  while (!r->stack_.empty()) {
    n = r->stack_.back();
    r->stack_.pop_back();
    Node* nn = &r->nodes_[n];
    if (nn->visited) continue;

    nn->visited = true;
    r->deltaf_.push_back(n);

    NodeIO* nn_io = &r->node_io_[n];
    for (auto w : nn_io->out.GetSequence()) {
      Node* nw = &r->nodes_[w];
      if (nw->rank == upper_bound) {
        return false;  // Cycle
      }
      if (!nw->visited && nw->rank < upper_bound) {
        r->stack_.push_back(w);
      }
    }
  }
  return true;
}